

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O0

void Fxu_MatrixComputeSinglesOne(Fxu_Matrix *p,Fxu_Var *pVar)

{
  Fxu_Var *pFVar1;
  int iVar2;
  int WeightCur;
  int Coin;
  Fxu_Var *pVar2;
  Fxu_Lit *pLitH;
  Fxu_Lit *pLitV;
  Fxu_Var *pVar_local;
  Fxu_Matrix *p_local;
  
  p->ppTailVars = &p->pOrderVars;
  p->pOrderVars = (Fxu_Var *)0x0;
  for (pLitH = (pVar->lLits).pHead; pLitH != (Fxu_Lit *)0x0; pLitH = pLitH->pVNext) {
    for (pVar2 = (Fxu_Var *)pLitH->pHPrev; pVar2 != (Fxu_Var *)0x0;
        pVar2 = (Fxu_Var *)(pVar2->lLits).pHead) {
      pFVar1 = (Fxu_Var *)pVar2->ppPairs;
      if (pFVar1->pOrder == (Fxu_Var *)0x0) {
        *p->ppTailVars = pFVar1;
        p->ppTailVars = &pFVar1->pOrder;
        pFVar1->pOrder = (Fxu_Var *)0x1;
      }
    }
  }
  if (p->pOrderVars != (Fxu_Var *)0x0) {
    for (_WeightCur = p->pOrderVars; _WeightCur != (Fxu_Var *)0x1; _WeightCur = _WeightCur->pOrder)
    {
      iVar2 = Fxu_SingleCountCoincidence(p,_WeightCur,pVar);
      if (iVar2 < 1) {
        __assert_fail("Coin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuSingle.c"
                      ,0xd9,"void Fxu_MatrixComputeSinglesOne(Fxu_Matrix *, Fxu_Var *)");
      }
      if (p->nWeightLimit <= iVar2 + -2) {
        Fxu_MatrixAddSingle(p,_WeightCur,pVar,iVar2 + -2);
      }
    }
  }
  Fxu_MatrixRingVarsUnmark(p);
  return;
}

Assistant:

void Fxu_MatrixComputeSinglesOne( Fxu_Matrix * p, Fxu_Var * pVar )
{
    Fxu_Lit * pLitV, * pLitH;
    Fxu_Var * pVar2;
    int Coin;
    int WeightCur;

    // start collecting the affected vars
    Fxu_MatrixRingVarsStart( p );
    // go through all the literals of this variable
    for ( pLitV = pVar->lLits.pHead; pLitV; pLitV = pLitV->pVNext )
        // for this literal, go through all the horizontal literals
        for ( pLitH = pLitV->pHPrev; pLitH; pLitH = pLitH->pHPrev )
        {
            // get another variable
            pVar2 = pLitH->pVar;
            // skip the var if it is already used
            if ( pVar2->pOrder )
                continue;
            // skip the var if it belongs to the same node
//            if ( pValue2Node[pVar->iVar] == pValue2Node[pVar2->iVar] )
//                continue;
            // collect the var
            Fxu_MatrixRingVarsAdd( p, pVar2 );
        }
    // stop collecting the selected vars
    Fxu_MatrixRingVarsStop( p );

    // iterate through the selected vars
    Fxu_MatrixForEachVarInRing( p, pVar2 )
    {
        // count the coincidence
        Coin = Fxu_SingleCountCoincidence( p, pVar2, pVar );
        assert( Coin > 0 );
        // get the new weight
        WeightCur = Coin - 2;
        // peformance fix (August 24, 2007)
//        if ( WeightCur >= 0 )
//        Fxu_MatrixAddSingle( p, pVar2, pVar, WeightCur );
        if ( WeightCur >= p->nWeightLimit )
            Fxu_MatrixAddSingle( p, pVar2, pVar, WeightCur );
    }
    // unmark the vars
    Fxu_MatrixRingVarsUnmark( p );
}